

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

bool __thiscall pbrt::DisplayItem::SendOpenImage(DisplayItem *this,IPCChannel *ipcChannel)

{
  bool bVar1;
  size_type sVar2;
  uchar *in_RSI;
  string *in_RDI;
  span<unsigned_char> sVar3;
  int c;
  int nChannels;
  uint8_t grabFocus;
  uint8_t *ptr;
  uint8_t buffer [1024];
  size_t in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffbb0 [16];
  int local_42c;
  uint8_t *local_420;
  uint8_t local_418 [32];
  IPCChannel *in_stack_fffffffffffffc08;
  span<const_unsigned_char> in_stack_fffffffffffffc10;
  
  local_420 = local_418;
  anon_unknown_2::Serialize<int>(&local_420,0);
  anon_unknown_2::Serialize<pbrt::(anonymous_namespace)::DisplayDirective>(&local_420,CreateImage);
  anon_unknown_2::Serialize<unsigned_char>(&local_420,'\x01');
  anon_unknown_2::Serialize(in_stack_fffffffffffffbb0._0_8_,in_RDI);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&in_RDI[2].field_2);
  anon_unknown_2::Serialize<int>(&local_420,(int)in_RDI[1]._M_string_length);
  anon_unknown_2::Serialize<int>(&local_420,*(int *)((long)&in_RDI[1]._M_string_length + 4));
  anon_unknown_2::Serialize<int>(&local_420,(int)sVar2);
  for (local_42c = 0; local_42c < (int)sVar2; local_42c = local_42c + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&in_RDI[2].field_2,(long)local_42c);
    anon_unknown_2::Serialize(in_stack_fffffffffffffbb0._0_8_,in_RDI);
  }
  sVar3 = pstd::MakeSpan<unsigned_char>(in_RSI,in_stack_fffffffffffffb98);
  pstd::span<unsigned_char_const>::span<pstd::span<unsigned_char>,void,pstd::span<unsigned_char>>
            ((span<const_unsigned_char> *)sVar3.ptr,(span<unsigned_char> *)in_RDI);
  bVar1 = IPCChannel::Send(in_stack_fffffffffffffc08,in_stack_fffffffffffffc10);
  return bVar1;
}

Assistant:

bool DisplayItem::SendOpenImage(IPCChannel &ipcChannel) {
    // Initial "open the image" message
    uint8_t buffer[1024];
    uint8_t *ptr = buffer;

    Serialize(&ptr, int(0));  // reserve space for message length
    Serialize(&ptr, DisplayDirective::CreateImage);
    uint8_t grabFocus = 1;
    Serialize(&ptr, grabFocus);
    Serialize(&ptr, title);

    int nChannels = channelNames.size();
    Serialize(&ptr, resolution.x);
    Serialize(&ptr, resolution.y);
    Serialize(&ptr, nChannels);
    for (int c = 0; c < nChannels; ++c)
        Serialize(&ptr, channelNames[c]);

    return ipcChannel.Send(pstd::MakeSpan(buffer, ptr - buffer));
}